

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O1

bool Grammar::is_identifier(string *str)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  iterator iVar5;
  long lVar6;
  
  if (str->_M_string_length == 0) {
    return false;
  }
  bVar2 = str_utils::is_alpha(*(str->_M_dataplus)._M_p);
  if (bVar2) {
    iVar1 = (int)str->_M_string_length;
    bVar2 = 1 < iVar1;
    if (1 < iVar1) {
      lVar6 = 1;
      do {
        bVar3 = str_utils::is_alphanumeric((str->_M_dataplus)._M_p[lVar6]);
        if ((!bVar3) && ((str->_M_dataplus)._M_p[lVar6] != '_')) {
          if (bVar2) goto LAB_00141451;
          break;
        }
        lVar6 = lVar6 + 1;
        lVar4 = (long)(int)str->_M_string_length;
        bVar2 = lVar6 < lVar4;
      } while (lVar6 < lVar4);
    }
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)RESERVED_WORDS_abi_cxx11_,str);
    bVar2 = iVar5._M_node == (_Base_ptr)(RESERVED_WORDS_abi_cxx11_ + 8);
  }
  else {
LAB_00141451:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Grammar::is_identifier(const std::string& str) {
    if (str.size() == 0 || !str_utils::is_alpha(str[0]))
        return false;
    for (int i = 1; i < int(str.size()); i++)
        if (!str_utils::is_alphanumeric(str[i]) && str[i] != '_')
            return false;
    return !is_reserved_word(str);
}